

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Gia_ManPerformGla(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  Vec_Ptr_t *p;
  Vec_Wrd_t *p_00;
  int *piVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Vec_Int_t **ppVVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Gia_Man_t *p_01;
  abctime aVar14;
  Abc_Cex_t *pAVar15;
  char *pcVar16;
  Vec_Wrd_t *p_02;
  Prf_Man_t *pPVar17;
  Vec_Int_t *pVVar18;
  Abc_Frame_t *pAbc;
  Abs_Par_t *pAVar19;
  abctime aVar20;
  abctime aVar21;
  int Fill;
  int Fill_00;
  uint uVar22;
  abctime time;
  int iVar23;
  uint uVar24;
  char *pcVar25;
  ulong uVar26;
  lit *begin;
  sat_solver2 *psVar27;
  Gia_Man_t *pGVar28;
  Prf_Man_t **p_03;
  ulong uVar29;
  double dVar30;
  undefined8 in_stack_fffffffffffffb68;
  undefined4 uVar32;
  undefined8 uVar31;
  double local_480;
  uint local_468;
  int Lit;
  int local_460;
  int local_45c;
  abctime local_458;
  int local_44c;
  uint local_448;
  int local_444;
  Gia_Man_t *local_440;
  Vec_Int_t **local_438;
  int local_42c;
  Gia_Man_t *local_428;
  Abs_Par_t *local_420;
  char Command [1000];
  
  uVar32 = (undefined4)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  pAVar19 = pPars;
  aVar11 = Abc_Clock();
  iVar7 = (int)pAVar19;
  pPars->iFrame = -1;
  if (pAig->vCos->nSize - pAig->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                  ,0x5e6,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
  }
  if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
    free(pAig->pCexSeq);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  pGVar12 = Gia_ManPo(pAig,iVar7);
  if ((~*(ulong *)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)) &
      0x1fffffff1fffffff) == 0) {
    pGVar28 = pAig;
    pGVar12 = Gia_ManPo(pAig,iVar7);
    if ((pGVar12->field_0x3 & 0x20) == 0) {
      Abc_Print((int)pGVar28,"Sequential miter is trivially UNSAT.\n");
      return 1;
    }
    iVar7 = pAig->nRegs;
    pAVar15 = Abc_CexMakeTriv(iVar7,pAig->vCis->nSize - iVar7,1,0);
    pAig->pCexSeq = pAVar15;
    Abc_Print(iVar7,"Sequential miter is trivially SAT.\n");
    return 0;
  }
  local_458 = aVar11;
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    pVVar13 = Vec_IntStart(pAig->nObjs);
    pAig->vGateClasses = pVVar13;
    iVar7 = 0;
    Vec_IntWriteEntry(pVVar13,0,1);
    pVVar13 = pAig->vGateClasses;
    pGVar12 = Gia_ManPo(pAig,iVar7);
    iVar7 = Gia_ObjFaninId0p(pAig,pGVar12);
    aVar11 = local_458;
    Vec_IntWriteEntry(pVVar13,iVar7,1);
  }
  pGVar28 = pAig;
  p_01 = (Gia_Man_t *)Ga2_ManStart(pAig,pPars);
  iVar7 = (int)pGVar28;
  aVar14 = Abc_Clock();
  p_01->pFanData = (int *)(aVar14 - aVar11);
  if (((Abs_Par_t *)p_01->pSpec)->fVerbose != 0) {
    Abc_Print(iVar7,"Running gate-level abstraction (GLA) with the following parameters:\n");
    uVar31 = CONCAT44(uVar32,pPars->nRatioMin2);
    Abc_Print(iVar7,
              "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n"
              ,(ulong)(uint)pPars->nFramesMax,(ulong)(uint)pPars->nConfLimit,
              (ulong)(uint)pPars->nTimeOut,(ulong)(uint)pPars->nRatioMin,uVar31,pPars->nRatioMax);
    Abc_Print(iVar7,
              "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n"
              ,(ulong)(uint)pPars->nLearnedStart,(ulong)(uint)pPars->nLearnedDelta,
              (ulong)(uint)pPars->nLearnedPerce,(ulong)(uint)pPars->fUseSkip,
              CONCAT44((int)((ulong)uVar31 >> 0x20),pPars->fUseSimple),
              pPars->fDumpMabs | pPars->fDumpVabs);
    if (pPars->fDumpVabs == 0) {
      if (pPars->fDumpMabs != 0) {
        pcVar25 = "Miter with abstraction map";
        goto LAB_00481ad9;
      }
    }
    else {
      pcVar25 = "Abstracted model";
LAB_00481ad9:
      pGVar28 = p_01;
      pcVar16 = Ga2_GlaGetFileName((Ga2_Man_t *)p_01,pPars->fDumpVabs);
      iVar7 = (int)pGVar28;
      Abc_Print(iVar7,"%s will be dumped into file \"%s\".\n",pcVar25,pcVar16);
    }
    Abc_Print(iVar7,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  local_438 = &pAig->vGateClasses;
  local_468 = 0xffffffff;
  local_45c = 0;
  uVar24 = 0;
  local_440 = pAig;
  local_428 = p_01;
  local_420 = pPars;
LAB_00481b31:
  iVar7 = -1;
  bVar5 = false;
  if ((int)uVar24 < pPars->nFramesMax || pPars->nFramesMax == 0) {
    ((Abs_Par_t *)p_01->pSpec)->iFrame = -1;
    Ga2_ManRestart((Ga2_Man_t *)p_01);
    local_448 = ((Vec_Int_t *)p_01->pMuxes)->nSize;
    for (uVar24 = 0; (int)uVar24 < pPars->nFramesMax || pPars->nFramesMax == 0; uVar24 = uVar24 + 1)
    {
      local_44c = (int)((*(sat_solver2 **)&p_01->fSweeper)->stats).conflicts;
      iVar7 = ((Vec_Int_t *)p_01->pMuxes)->nSize;
      local_444 = (*(Vec_Int_t **)&p_01->nXors)->nSize;
      ((Abs_Par_t *)p_01->pSpec)->iFrame = uVar24;
      p = *(Vec_Ptr_t **)&p_01->nHTable;
      if (uVar24 == p->nSize) {
        pVVar13 = Vec_IntAlloc(0);
        Vec_PtrPush(p,pVVar13);
      }
      pVVar13 = Ga2_MapFrameMap((Ga2_Man_t *)p_01,uVar24);
      Vec_IntFillExtra(pVVar13,(*(Vec_Int_t **)&p_01->nXors)->nSize,-1);
      uVar8 = uVar24;
      Ga2_ManAddAbsClauses((Ga2_Man_t *)p_01,uVar24);
      pGVar28 = local_440;
      pAVar19 = (Abs_Par_t *)p_01->pSpec;
      if (((pAVar19->fUseSkip == 0) || (pAVar19->iFrameProved < (int)uVar24)) &&
         (pAVar19->nFramesStart < (int)uVar24 || pAVar19->nFramesStart == 0)) {
        local_42c = iVar7;
        pGVar12 = Gia_ManPo(local_440,uVar8);
        pGVar12 = pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff);
        uVar8 = Ga2_ObjFindLit((Ga2_Man_t *)p_01,pGVar12,uVar24);
        Lit = uVar8;
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                        ,0x62e,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
        }
        pGVar12 = Gia_ManPo(pGVar28,(int)pGVar12);
        Lit = *(uint *)pGVar12 >> 0x1d & 1 ^ uVar8;
        if (Lit != 0) {
          if (Lit == 1) {
            __assert_fail("Lit > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                          ,0x632,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
          }
          iVar7 = *(int *)&p_01->pRefs;
          if ((*(sat_solver2 **)&p_01->fSweeper)->size < iVar7) {
            sat_solver2_setnvars(*(sat_solver2 **)&p_01->fSweeper,iVar7);
            iVar7 = *(int *)&p_01->pRefs;
          }
          local_460 = iVar7;
          iVar7 = 0;
          while( true ) {
            psVar27 = *(sat_solver2 **)&p_01->fSweeper;
            uVar8 = Abc_Lit2Var(Lit);
            iVar9 = var_is_assigned(psVar27,uVar8);
            if (iVar9 != 0) break;
            aVar11 = Abc_Clock();
            psVar27 = *(sat_solver2 **)&p_01->fSweeper;
            begin = &Lit;
            iVar9 = sat_solver2_solve(psVar27,begin,&local_460,(long)pPars->nConfLimit,0,0,0);
            uVar8 = (uint)begin;
            if (iVar9 != 1) {
              aVar14 = Abc_Clock();
              p_01->vFanoutNums = (Vec_Int_t *)((long)p_01->vFanoutNums + (aVar14 - aVar11));
              if (iVar9 == 0) {
LAB_004823e5:
                bVar5 = false;
                iVar7 = -1;
                goto LAB_004823eb;
              }
              psVar27 = *(sat_solver2 **)&p_01->fSweeper;
              if (psVar27->nRuntimeLimit != 0) {
                aVar11 = Abc_Clock();
                psVar27 = *(sat_solver2 **)&p_01->fSweeper;
                if (psVar27->nRuntimeLimit < aVar11) goto LAB_00482994;
              }
              iVar9 = local_42c;
              pAVar19 = (Abs_Par_t *)p_01->pSpec;
              if (iVar7 == 0) {
                iVar7 = 0;
                if (pAVar19->iFrameProved < (int)uVar24) {
                  pAVar19->nFramesNoChange = pAVar19->nFramesNoChange + 1;
                }
                goto LAB_004821a0;
              }
              if (pAVar19->iFrameProved < (int)uVar24) {
                pAVar19->nFramesNoChange = 0;
              }
              if (psVar27->pPrf2 == (Prf_Man_t *)0x0) {
                __assert_fail("p->pSat->pPrf2 != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x694,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              pVVar13 = (Vec_Int_t *)Sat_ProofCore(psVar27);
              Prf_ManStopP(&(*(sat_solver2 **)&p_01->fSweeper)->pPrf2);
              sat_solver2_rollback(*(sat_solver2 **)&p_01->fSweeper);
              iVar23 = local_460;
              Ga2_ManShrinkAbs((Ga2_Man_t *)p_01,iVar9,local_444,local_460);
              if (iVar23 != (*(sat_solver2 **)&p_01->fSweeper)->size) {
                __assert_fail("nVarsOld == p->pSat->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6a4,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              sat_solver2_bookmark(*(sat_solver2 **)&p_01->fSweeper);
              if ((*(sat_solver2 **)&p_01->fSweeper)->pPrf2 != (Prf_Man_t *)0x0) {
                __assert_fail("p->pSat->pPrf2 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6a7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              pPVar17 = Prf_ManAlloc();
              (*(sat_solver2 **)&p_01->fSweeper)->pPrf2 = pPVar17;
              if (pPVar17 != (Prf_Man_t *)0x0) {
                p_01->nBufs = 0;
                Vec_IntFill((Vec_Int_t *)p_01->pObjs,((Gia_Man_t *)p_01->pName)->nObjs,Fill_00);
                Prf_ManRestart((*(sat_solver2 **)&p_01->fSweeper)->pPrf2,(Vec_Int_t *)p_01->pObjs,
                               ((*(sat_solver2 **)&p_01->fSweeper)->stats).learnts,pVVar13->nSize);
                Ga2_ManAddToAbs((Ga2_Man_t *)p_01,pVVar13);
                Vec_IntFree(pVVar13);
              }
              aVar11 = Abc_Clock();
              bVar5 = false;
              iVar23 = sat_solver2_solve(*(sat_solver2 **)&p_01->fSweeper,&Lit,&local_460,
                                         (long)pPars->nConfLimit,0,0,0);
              if (iVar23 != -1) {
                iVar7 = -1;
                if (iVar23 != 0) {
                  __assert_fail("Status == l_False",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                                ,0x6b7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
                }
                goto LAB_004823eb;
              }
              aVar14 = Abc_Clock();
              p_01->vFanoutNums = (Vec_Int_t *)((long)p_01->vFanoutNums + (aVar14 - aVar11));
              if ((*(sat_solver2 **)&p_01->fSweeper)->pPrf2 == (Prf_Man_t *)0x0) {
                __assert_fail("p->pSat->pPrf2 != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6bb,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              pVVar18 = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)&p_01->fSweeper);
              Prf_ManStopP(&(*(sat_solver2 **)&p_01->fSweeper)->pPrf2);
              sat_solver2_rollback(*(sat_solver2 **)&p_01->fSweeper);
              Ga2_ManShrinkAbs((Ga2_Man_t *)p_01,iVar9,local_444,local_460);
              pVVar13 = pVVar18;
              Ga2_ManAddToAbs((Ga2_Man_t *)p_01,pVVar18);
              uVar8 = (uint)pVVar13;
              Vec_IntFree(pVVar18);
              goto LAB_004821a0;
            }
            piVar1 = (int *)((long)&p_01->pRefs + 4);
            *piVar1 = *piVar1 + 1;
            aVar14 = Abc_Clock();
            *(long *)&p_01->nFansAlloc = *(long *)&p_01->nFansAlloc + (aVar14 - aVar11);
            iVar9 = Abc_FrameIsBridgeMode();
            if (local_45c != 0 && iVar9 != 0) {
              Gia_Ga2SendCancel((Ga2_Man_t *)psVar27,uVar8);
              local_45c = 0;
            }
            if (-1 < (int)local_468) {
              Gia_GlaProveCancel(pPars->fVerbose);
              local_468 = 0xffffffff;
            }
            aVar11 = Abc_Clock();
            ((Rnm_Man_t *)p_01->pHTable)->nRefId = iVar7;
            pVVar13 = Ga2_ManRefine((Ga2_Man_t *)p_01);
            aVar14 = Abc_Clock();
            p_01->vFanout = (Vec_Int_t *)((long)p_01->vFanout + (aVar14 - aVar11));
            if (pVVar13 == (Vec_Int_t *)0x0) {
              if (pPars->fVerbose != 0) {
                iVar9 = (int)((*(sat_solver2 **)&p_01->fSweeper)->stats).conflicts - local_44c;
                aVar11 = Abc_Clock();
                Ga2_ManAbsPrintFrame((Ga2_Man_t *)p_01,uVar24,iVar9,iVar7,aVar11 - local_458,1);
              }
              goto LAB_004823e5;
            }
            psVar27 = *(sat_solver2 **)&p_01->fSweeper;
            if (iVar7 == 0) {
              if (local_460 != psVar27->size) {
                __assert_fail("nVarsOld == p->pSat->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x666,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              sat_solver2_bookmark(psVar27);
              if ((*(sat_solver2 **)&p_01->fSweeper)->pPrf2 != (Prf_Man_t *)0x0) {
                __assert_fail("p->pSat->pPrf2 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x669,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              pPVar17 = Prf_ManAlloc();
              (*(sat_solver2 **)&p_01->fSweeper)->pPrf2 = pPVar17;
              if (pPVar17 != (Prf_Man_t *)0x0) {
                p_01->nBufs = 0;
                Vec_IntFill((Vec_Int_t *)p_01->pObjs,((Gia_Man_t *)p_01->pName)->nObjs,Fill);
                Prf_ManRestart((*(sat_solver2 **)&p_01->fSweeper)->pPrf2,(Vec_Int_t *)p_01->pObjs,
                               ((*(sat_solver2 **)&p_01->fSweeper)->stats).learnts,pVVar13->nSize);
              }
            }
            else {
              pPVar17 = psVar27->pPrf2;
              if (pPVar17 != (Prf_Man_t *)0x0) {
                if (pPVar17->iFirst < 0) {
                  __assert_fail("p->iFirst >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
                }
                if (pPVar17->pInfo != (word *)0x0) {
                  __assert_fail("p->pInfo == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                                ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
                }
                uVar8 = pVVar13->nSize + p_01->nBufs;
                iVar9 = pPVar17->nWords;
                if (iVar9 * 0x40 <= (int)uVar8) {
                  iVar23 = (((int)uVar8 >> 6) + 1) - (uint)((uVar8 & 0x3f) == 0);
                  iVar10 = iVar9 * 2;
                  if (iVar23 == iVar10 || SBORROW4(iVar23,iVar10) != iVar23 + iVar9 * -2 < 0) {
                    iVar23 = iVar10;
                  }
                  uVar29 = (long)pPVar17->vInfo->nSize / (long)iVar9;
                  iVar9 = (int)uVar29;
                  p_02 = Vec_WrdAlloc((iVar9 + 1000) * iVar23);
                  uVar26 = 0;
                  uVar29 = uVar29 & 0xffffffff;
                  if (iVar9 < 1) {
                    uVar29 = uVar26;
                  }
                  while( true ) {
                    p_00 = pPVar17->vInfo;
                    iVar9 = (int)uVar26;
                    if (iVar9 == (int)uVar29) break;
                    iVar10 = pPVar17->nWords;
                    uVar8 = iVar10 * iVar9;
                    if (((int)uVar8 < 0) || (p_00->nSize <= (int)uVar8)) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                                    ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                    }
                    pPVar17->pInfo = p_00->pArray + uVar8;
                    for (uVar26 = 0; (long)uVar26 < (long)iVar10; uVar26 = uVar26 + 1) {
                      Vec_WrdPush(p_02,pPVar17->pInfo[uVar26]);
                      iVar10 = pPVar17->nWords;
                    }
                    for (; (int)uVar26 < iVar23; uVar26 = (ulong)((int)uVar26 + 1)) {
                      Vec_WrdPush(p_02,0);
                    }
                    uVar26 = (ulong)(iVar9 + 1);
                  }
                  Vec_WrdFree(p_00);
                  pPVar17->vInfo = p_02;
                  pPVar17->nWords = iVar23;
                  pPVar17->pInfo = (word *)0x0;
                  p_01 = local_428;
                }
              }
            }
            Ga2_ManAddToAbs((Ga2_Man_t *)p_01,pVVar13);
            Vec_IntFree(pVVar13);
            pPars = local_420;
            if (local_420->fVerbose != 0) {
              iVar9 = (int)((*(sat_solver2 **)&p_01->fSweeper)->stats).conflicts - local_44c;
              aVar11 = Abc_Clock();
              Ga2_ManAbsPrintFrame((Ga2_Man_t *)p_01,uVar24,iVar9,iVar7 + 1,aVar11 - local_458,0);
            }
            if ((pPars->nRatioMin2 != 0) &&
               ((pPars->nRatioMin2 * *(int *)((long)&p_01->vCis + 4)) / 100 <=
                ((Vec_Int_t *)p_01->pMuxes)->nSize)) goto LAB_004823e5;
            iVar7 = iVar7 + 1;
          }
          Prf_ManStopP(&(*(sat_solver2 **)&p_01->fSweeper)->pPrf2);
LAB_004821a0:
          if (((Abs_Par_t *)p_01->pSpec)->iFrameProved < (int)uVar24) {
            ((Abs_Par_t *)p_01->pSpec)->iFrameProved = uVar24;
          }
          if (pPars->fVerbose == 0) {
            pGVar28 = (Gia_Man_t *)0x0;
          }
          else {
            iVar9 = (int)((*(sat_solver2 **)&p_01->fSweeper)->stats).conflicts - local_44c;
            aVar11 = Abc_Clock();
            uVar8 = uVar24;
            Ga2_ManAbsPrintFrame((Ga2_Man_t *)p_01,uVar24,iVar9,iVar7,aVar11 - local_458,1);
            pGVar28 = (Gia_Man_t *)(ulong)(uint)pPars->fVerbose;
          }
          iVar9 = Gia_GlaProveCheck((int)pGVar28);
          if (iVar9 != 0) {
            bVar5 = true;
            iVar7 = 1;
            goto LAB_004823eb;
          }
          if (iVar7 != 0) {
            if (((Abs_Par_t *)p_01->pSpec)->fVeryVerbose != 0) {
              uVar8 = 0x6ae1ea;
              Abc_Print((int)pGVar28,"\n");
            }
            ppVVar6 = local_438;
            Vec_IntFreeP(local_438);
            pGVar28 = p_01;
            pVVar13 = Ga2_ManAbsTranslate((Ga2_Man_t *)p_01);
            *ppVVar6 = pVVar13;
            if ((pPars->nRatioMin != 0) &&
               (uVar8 = 100,
               (pPars->nRatioMin * *(int *)((long)&p_01->vCis + 4)) / 100 <=
               ((Vec_Int_t *)p_01->pMuxes)->nSize)) {
LAB_00482994:
              iVar7 = -1;
              bVar5 = false;
              goto LAB_004823eb;
            }
          }
          pAVar19 = (Abs_Par_t *)p_01->pSpec;
          if (pAVar19->nFramesNoChange == pAVar19->nFramesNoChangeLim) {
            if ((pAVar19->fDumpVabs != 0) || (pAVar19->fDumpMabs != 0)) {
              Abc_FrameSetStatus(-1);
              Abc_FrameSetCex((Abc_Cex_t *)0x0);
              Abc_FrameSetNFrames(uVar24);
              pcVar25 = ((Abs_Par_t *)p_01->pSpec)->pFileVabs;
              if (pcVar25 == (char *)0x0) {
                pcVar25 = "glabs.aig";
              }
              pcVar25 = Extra_FileNameGenericAppend(pcVar25,".status");
              sprintf(Command,"write_status %s",pcVar25);
              pAbc = Abc_FrameGetGlobalFrame();
              Cmd_CommandExecute(pAbc,Command);
              uVar8 = pPars->fVerbose;
              pGVar28 = p_01;
              Ga2_GlaDumpAbsracted((Ga2_Man_t *)p_01,uVar8);
              pAVar19 = (Abs_Par_t *)p_01->pSpec;
            }
            if (pAVar19->fCallProver != 0) {
              if (-1 < (int)local_468) {
                Gia_GlaProveCancel(pPars->fVerbose);
              }
              uVar8 = pPars->fSimpProver;
              pGVar28 = local_440;
              Gia_GlaProveAbsracted(local_440,uVar8,pPars->fVeryVerbose);
              piVar1 = (int *)((long)&p_01->vLevels + 4);
              *piVar1 = *piVar1 + 1;
              local_468 = uVar24;
            }
            iVar9 = Abc_FrameIsBridgeMode();
            if (iVar9 != 0) {
              if (local_45c != 0) {
                Gia_Ga2SendCancel((Ga2_Man_t *)pGVar28,uVar8);
              }
              Gia_Ga2SendAbsracted((Ga2_Man_t *)p_01,uVar8);
              local_45c = 1;
            }
          }
          if ((pPars->nRatioMax != 0 && iVar7 != 0) &&
             (((iVar7 = ((Vec_Int_t *)p_01->pMuxes)->nSize, 0x14 < uVar24 || (100 < iVar7)) &&
              ((int)(pPars->nRatioMax * local_448) / 100 <= (int)(iVar7 - local_448))))) {
            if (((Abs_Par_t *)p_01->pSpec)->fVerbose != 0) {
              Abc_Print(100,
                        "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n"
                        ,(ulong)local_448);
            }
            break;
          }
        }
      }
    }
    goto LAB_00481b31;
  }
LAB_004823eb:
  p_03 = &(*(sat_solver2 **)&p_01->fSweeper)->pPrf2;
  Prf_ManStopP(p_03);
  iVar9 = (int)p_03;
  if (-1 < (int)local_468) {
    iVar9 = pPars->fVerbose;
    Gia_GlaProveCancel(iVar9);
  }
  if (*(int *)&p_01->vCos == 0) {
    Abc_Print(iVar9,"\n");
  }
  ppVVar6 = local_438;
  pGVar28 = local_440;
  if (bVar5) {
    pcVar25 = "GLA completed %d frames and proved abstraction derived in frame %d  ";
    Abc_Print(iVar9,"GLA completed %d frames and proved abstraction derived in frame %d  ",
              (ulong)(((Abs_Par_t *)p_01->pSpec)->iFrameProved + 1),(ulong)local_468);
    iVar7 = 1;
    aVar11 = local_458;
    goto LAB_004824c7;
  }
  pAVar15 = local_440->pCexSeq;
  if (pAVar15 != (Abc_Cex_t *)0x0) {
    if (((Abs_Par_t *)p_01->pSpec)->fVerbose != 0) {
      Abc_Print(iVar9,"\n");
      pAVar15 = pGVar28->pCexSeq;
    }
    iVar7 = 0;
    iVar9 = Gia_ManVerifyCex(pGVar28,pAVar15,0);
    iVar23 = (int)pGVar28;
    if (iVar9 == 0) {
      Abc_Print(iVar23,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    pcVar25 = "True counter-example detected in frame %d.  ";
    Abc_Print(iVar23,"True counter-example detected in frame %d.  ",(ulong)uVar24);
    ((Abs_Par_t *)p_01->pSpec)->iFrame = uVar24 - 1;
    Vec_IntFreeP(local_438);
    aVar11 = local_458;
    goto LAB_004824c7;
  }
  Vec_IntFreeP(local_438);
  pGVar28 = p_01;
  pVVar13 = Ga2_ManAbsTranslate((Ga2_Man_t *)p_01);
  iVar9 = (int)pGVar28;
  *ppVVar6 = pVVar13;
  if ((((Abs_Par_t *)p_01->pSpec)->nTimeOut == 0) ||
     (aVar11 = Abc_Clock(), aVar11 < (*(sat_solver2 **)&p_01->fSweeper)->nRuntimeLimit)) {
    aVar11 = local_458;
    uVar24 = pPars->nConfLimit;
    if ((uVar24 == 0) || ((int)((*(sat_solver2 **)&p_01->fSweeper)->stats).conflicts < (int)uVar24))
    {
      uVar24 = pPars->nRatioMin2;
      if ((uVar24 == 0) ||
         (((Vec_Int_t *)p_01->pMuxes)->nSize < (int)(*(int *)((long)&p_01->vCis + 4) * uVar24) / 100
         )) {
        uVar24 = pPars->nRatioMin;
        if (uVar24 == 0) {
          pAVar19 = (Abs_Par_t *)p_01->pSpec;
        }
        else {
          pAVar19 = (Abs_Par_t *)p_01->pSpec;
          if ((int)(*(int *)((long)&p_01->vCis + 4) * uVar24) / 100 <=
              ((Vec_Int_t *)p_01->pMuxes)->nSize) {
            iVar9 = pAVar19->iFrameProved;
            pcVar25 = "GLA found that the size of abstraction exceeds %d %% in frame %d.  ";
            goto LAB_00482990;
          }
        }
        uVar8 = pAVar19->nFramesNoChange;
        uVar22 = pAVar19->iFrameProved + 1;
        pcVar25 = "GLA finished %d frames and produced a %d-stable abstraction.  ";
      }
      else {
        iVar9 = ((Abs_Par_t *)p_01->pSpec)->iFrameProved;
        pcVar25 = 
        "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ";
LAB_00482990:
        uVar8 = iVar9 + 1;
        uVar22 = uVar24;
      }
      Abc_Print(uVar24,pcVar25,(ulong)uVar22,(ulong)uVar8);
    }
    else {
      pcVar25 = "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
      Abc_Print(iVar9,"GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ",
                (ulong)uVar24,(ulong)(((Abs_Par_t *)p_01->pSpec)->iFrameProved + 1),
                (ulong)(uint)((Abs_Par_t *)p_01->pSpec)->nFramesNoChange);
    }
  }
  else {
    pAVar19 = (Abs_Par_t *)p_01->pSpec;
    pcVar25 = "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ";
    Abc_Print(iVar9,"GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ",
              (ulong)(uint)pAVar19->nTimeOut,(ulong)(pAVar19->iFrameProved + 1),
              (ulong)(uint)pAVar19->nFramesNoChange);
    aVar11 = local_458;
  }
  ((Abs_Par_t *)p_01->pSpec)->iFrame = ((Abs_Par_t *)p_01->pSpec)->iFrameProved;
LAB_004824c7:
  aVar14 = Abc_Clock();
  iVar9 = (int)aVar14 - (int)aVar11;
  Abc_PrintTime(iVar9,pcVar25,time);
  if (((Abs_Par_t *)p_01->pSpec)->fVerbose != 0) {
    aVar14 = Abc_Clock();
    p_01->vMapping =
         (Vec_Int_t *)
         (aVar14 - ((long)p_01->pFanData +
                   (long)&p_01->vFanout->nCap +
                   (long)&p_01->vFanoutNums->nCap + aVar11 + *(long *)&p_01->nFansAlloc));
    Abc_Print(iVar9,"%s =","Runtime: Initializing");
    piVar1 = p_01->pFanData;
    aVar14 = Abc_Clock();
    local_480 = 0.0;
    dVar30 = 0.0;
    if (aVar14 != aVar11) {
      piVar2 = p_01->pFanData;
      aVar14 = Abc_Clock();
      dVar30 = ((double)(long)piVar2 * 100.0) / (double)(aVar14 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar1 / 1000000.0,dVar30);
    Abc_Print(iVar9,"%s =","Runtime: Solver UNSAT");
    pVVar13 = p_01->vFanoutNums;
    aVar14 = Abc_Clock();
    if (aVar14 != aVar11) {
      pVVar18 = p_01->vFanoutNums;
      aVar14 = Abc_Clock();
      local_480 = ((double)(long)pVVar18 * 100.0) / (double)(aVar14 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar13 / 1000000.0,local_480);
    Abc_Print(iVar9,"%s =","Runtime: Solver SAT  ");
    lVar3 = *(long *)&p_01->nFansAlloc;
    aVar14 = Abc_Clock();
    local_480 = 0.0;
    dVar30 = 0.0;
    if (aVar14 != aVar11) {
      lVar4 = *(long *)&p_01->nFansAlloc;
      aVar14 = Abc_Clock();
      dVar30 = ((double)lVar4 * 100.0) / (double)(aVar14 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)lVar3 / 1000000.0,dVar30);
    Abc_Print(iVar9,"%s =","Runtime: Refinement  ");
    pVVar13 = p_01->vFanout;
    aVar14 = Abc_Clock();
    if (aVar14 != aVar11) {
      pVVar18 = p_01->vFanout;
      aVar14 = Abc_Clock();
      local_480 = ((double)(long)pVVar18 * 100.0) / (double)(aVar14 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar13 / 1000000.0,local_480);
    Abc_Print(iVar9,"%s =","Runtime: Other       ");
    pVVar13 = p_01->vMapping;
    aVar14 = Abc_Clock();
    local_480 = 0.0;
    dVar30 = 0.0;
    if (aVar14 != aVar11) {
      pVVar18 = p_01->vMapping;
      aVar14 = Abc_Clock();
      dVar30 = ((double)(long)pVVar18 * 100.0) / (double)(aVar14 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar13 / 1000000.0,dVar30);
    Abc_Print(iVar9,"%s =","Runtime: TOTAL       ");
    aVar14 = Abc_Clock();
    aVar20 = Abc_Clock();
    if (aVar20 != aVar11) {
      aVar20 = Abc_Clock();
      aVar21 = Abc_Clock();
      local_480 = ((double)(aVar20 - aVar11) * 100.0) / (double)(aVar21 - aVar11);
    }
    Abc_Print(iVar9,"%9.2f sec (%6.2f %%)\n",(double)(aVar14 - aVar11) / 1000000.0,local_480);
    Ga2_ManReportMemory((Ga2_Man_t *)p_01);
  }
  Ga2_ManStop((Ga2_Man_t *)p_01);
  fflush(_stdout);
  return iVar7;
}

Assistant:

int Gia_ManPerformGla( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    int fUseSecondCore = 1;
    Ga2_Man_t * p;
    Vec_Int_t * vCore, * vPPis;
    abctime clk2, clk = Abc_Clock();
    int Status = l_Undef, RetValue = -1, iFrameTryToProve = -1, fOneIsSent = 0;
    int i, c, f, Lit;
    pPars->iFrame = -1;
    // check trivial case 
    assert( Gia_ManPoNum(pAig) == 1 ); 
    ABC_FREE( pAig->pCexSeq );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            Abc_Print( 1, "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        Abc_Print( 1, "Sequential miter is trivially SAT.\n" );
        return 0;
    }
    // create gate classes if not given
    if ( pAig->vGateClasses == NULL )
    {
        pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
        Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
        Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
    }
    // start the manager
    p = Ga2_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin, pPars->nRatioMin2, pPars->nRatioMax );
        Abc_Print( 1, "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce, pPars->fUseSkip, pPars->fUseSimple, pPars->fDumpVabs|pPars->fDumpMabs );
        if ( pPars->fDumpVabs || pPars->fDumpMabs )
            Abc_Print( 1, "%s will be dumped into file \"%s\".\n", 
                pPars->fDumpVabs ? "Abstracted model" : "Miter with abstraction map",
                Ga2_GlaGetFileName(p, pPars->fDumpVabs) );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    // iterate unrolling
    for ( i = f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; i++ )
    {
        int nAbsOld;
        // remember the timeframe
        p->pPars->iFrame = -1;
        // create new SAT solver
        Ga2_ManRestart( p );
        // remember abstraction size after the last restart
        nAbsOld = Vec_IntSize(p->vAbs);
        // unroll the circuit
        for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f++ )
        {
            // remember current limits
            int nConflsBeg = sat_solver2_nconflicts(p->pSat);
            int nAbs       = Vec_IntSize(p->vAbs);
            int nValues    = Vec_IntSize(p->vValues);
            int nVarsOld;
            // remember the timeframe
            p->pPars->iFrame = f;
            // extend and clear storage
            if ( f == Vec_PtrSize(p->vId2Lit) )
                Vec_PtrPush( p->vId2Lit, Vec_IntAlloc(0) );
            Vec_IntFillExtra( Ga2_MapFrameMap(p, f), Vec_IntSize(p->vValues), -1 );
            // add static clauses to this timeframe
            Ga2_ManAddAbsClauses( p, f );
            // skip checking if skipcheck is enabled (&gla -s)
            if ( p->pPars->fUseSkip && f <= p->pPars->iFrameProved )
                continue;
            // skip checking if we need to skip several starting frames (&gla -S <num>)
            if ( p->pPars->nFramesStart && f <= p->pPars->nFramesStart )
                continue;
            // get the output literal
//            Lit = Ga2_ManUnroll_rec( p, Gia_ManPo(pAig,0), f );
            Lit = Ga2_ObjFindLit( p, Gia_ObjFanin0(Gia_ManPo(pAig,0)), f );
            assert( Lit >= 0 );
            Lit = Abc_LitNotCond( Lit, Gia_ObjFaninC0(Gia_ManPo(pAig,0)) );
            if ( Lit == 0 )
                continue;
            assert( Lit > 1 );
            // check for counter-examples
            if ( p->nSatVars > sat_solver2_nvars(p->pSat) )
                sat_solver2_setnvars( p->pSat, p->nSatVars );
            nVarsOld = p->nSatVars;
            for ( c = 0; ; c++ )
            {
                // consider the special case when the target literal is implied false
                // by implications which happened as a result of previous refinements
                // note that incremental UNSAT core cannot be computed because there is no learned clauses
                // in this case, we will assume that UNSAT core cannot reduce the problem
                if ( var_is_assigned(p->pSat, Abc_Lit2Var(Lit)) )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    break;
                }
                // perform SAT solving
                clk2 = Abc_Clock();
                Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( Status == l_True ) // perform refinement
                {
                    p->nCexes++;
                    p->timeSat += Abc_Clock() - clk2;

                    // cancel old one if it was sent
                    if ( Abc_FrameIsBridgeMode() && fOneIsSent )
                    {
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                        fOneIsSent = 0;
                    }
                    if ( iFrameTryToProve >= 0 )
                    {
                        Gia_GlaProveCancel( pPars->fVerbose );
                        iFrameTryToProve = -1;
                    }

                    // perform refinement
                    clk2 = Abc_Clock();
                    Rnm_ManSetRefId( p->pRnm, c );
                    vPPis = Ga2_ManRefine( p );
                    p->timeCex += Abc_Clock() - clk2;
                    if ( vPPis == NULL )
                    {
                        if ( pPars->fVerbose )
                            Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
                        goto finish;
                    }

                    if ( c == 0 )
                    {
//                        Ga2_ManRefinePrintPPis( p );
                        // create bookmark to be used for rollback
                        assert( nVarsOld == p->pSat->size );
                        sat_solver2_bookmark( p->pSat );
                        // start incremental proof manager
                        assert( p->pSat->pPrf2 == NULL );
                        p->pSat->pPrf2 = Prf_ManAlloc();
                        if ( p->pSat->pPrf2 )
                        {
                            p->nProofIds = 0;
                            Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                            Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                        }
                    }
                    else
                    {
                        // resize the proof logger
                        if ( p->pSat->pPrf2 )
                            Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
                    }

                    Ga2_ManAddToAbs( p, vPPis );
                    Vec_IntFree( vPPis );
                    if ( pPars->fVerbose )
                        Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c+1, Abc_Clock() - clk, 0 );
                    // check if the number of objects is below limit
                    if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
                    {
                        Status = l_Undef;
                        goto finish;
                    }
                    continue;
                }
                p->timeUnsat += Abc_Clock() - clk2;
                if ( Status == l_Undef ) // ran out of resources
                    goto finish;
                if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit ) // timeout
                    goto finish;
                if ( c == 0 )
                {
                    if ( f > p->pPars->iFrameProved )
                        p->pPars->nFramesNoChange++;
                    break;
                }
                if ( f > p->pPars->iFrameProved )
                    p->pPars->nFramesNoChange = 0;

                // derive the core
                assert( p->pSat->pPrf2 != NULL );
                vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                Prf_ManStopP( &p->pSat->pPrf2 );
                // update the SAT solver
                sat_solver2_rollback( p->pSat );
                // reduce abstraction
                Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );

                // purify UNSAT core
                if ( fUseSecondCore )
                {
//                    int nOldCore = Vec_IntSize(vCore);
                    // reverse the order of objects in the core
//                    Vec_IntSort( vCore, 0 );
//                    Vec_IntPrint( vCore );
                    // create bookmark to be used for rollback
                    assert( nVarsOld == p->pSat->size );
                    sat_solver2_bookmark( p->pSat );
                    // start incremental proof manager
                    assert( p->pSat->pPrf2 == NULL );
                    p->pSat->pPrf2 = Prf_ManAlloc();
                    if ( p->pSat->pPrf2 )
                    {
                        p->nProofIds = 0;
                        Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                        Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vCore) );

                        Ga2_ManAddToAbs( p, vCore );
                        Vec_IntFree( vCore );
                    }
                    // run SAT solver
                    clk2 = Abc_Clock();
                    Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                    if ( Status == l_Undef )
                        goto finish;
                    assert( Status == l_False );
                    p->timeUnsat += Abc_Clock() - clk2;

                    // derive the core
                    assert( p->pSat->pPrf2 != NULL );
                    vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    // update the SAT solver
                    sat_solver2_rollback( p->pSat );
                    // reduce abstraction
                    Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );
//                    printf( "\n%4d -> %4d\n", nOldCore, Vec_IntSize(vCore) );
                }

                Ga2_ManAddToAbs( p, vCore );
//                Ga2_ManRefinePrint( p, vCore );
                Vec_IntFree( vCore );
                break;
            }
            // remember the last proved frame
            if ( p->pPars->iFrameProved < f )
                p->pPars->iFrameProved = f;
            // print statistics
            if ( pPars->fVerbose )
                Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
            // check if abstraction was proved
            if ( Gia_GlaProveCheck( pPars->fVerbose ) )
            {
                RetValue = 1;
                goto finish;
            }
            if ( c > 0 ) 
            {
                if ( p->pPars->fVeryVerbose )
                    Abc_Print( 1, "\n" );
                // recompute the abstraction
                Vec_IntFreeP( &pAig->vGateClasses );
                pAig->vGateClasses = Ga2_ManAbsTranslate( p );
                // check if the number of objects is below limit
                if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
                {
                    Status = l_Undef;
                    goto finish;
                }
            }
            // check the number of stable frames
            if ( p->pPars->nFramesNoChange == p->pPars->nFramesNoChangeLim )
            {
                // dump the model into file
                if ( p->pPars->fDumpVabs || p->pPars->fDumpMabs )
                {
                    char Command[1000];
                    Abc_FrameSetStatus( -1 );
                    Abc_FrameSetCex( NULL );
                    Abc_FrameSetNFrames( f );
                    sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status"));
                    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                    Ga2_GlaDumpAbsracted( p, pPars->fVerbose );
                }
                // call the prover
                if ( p->pPars->fCallProver )
                {
                    // cancel old one if it is proving
                    if ( iFrameTryToProve >= 0 )
                        Gia_GlaProveCancel( pPars->fVerbose );
                    // prove new one
                    Gia_GlaProveAbsracted( pAig, pPars->fSimpProver, pPars->fVeryVerbose );
                    iFrameTryToProve = f;
                    p->nPdrCalls++;
                }
                // speak to the bridge
                if ( Abc_FrameIsBridgeMode() )
                {
                    // cancel old one if it was sent
                    if ( fOneIsSent )
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                    // send new one 
                    Gia_Ga2SendAbsracted( p, pPars->fVerbose );
                    fOneIsSent = 1;
                }
            }
            // if abstraction grew more than a certain percentage, force a restart
            if ( pPars->nRatioMax == 0 )
                continue;
            if ( c > 0 && (f > 20 || Vec_IntSize(p->vAbs) > 100) && Vec_IntSize(p->vAbs) - nAbsOld >= nAbsOld * pPars->nRatioMax / 100 )
            {
                if ( p->pPars->fVerbose )
                Abc_Print( 1, "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n", 
                    nAbsOld, Vec_IntSize(p->vAbs), pPars->nRatioMax );
                break;
            }
        }
    }
finish:
    Prf_ManStopP( &p->pSat->pPrf2 );
    // cancel old one if it is proving
    if ( iFrameTryToProve >= 0 )
        Gia_GlaProveCancel( pPars->fVerbose );
    // analize the results
    if ( !p->fUseNewLine )
        Abc_Print( 1, "\n" );
    if ( RetValue == 1 )
        Abc_Print( 1, "GLA completed %d frames and proved abstraction derived in frame %d  ", p->pPars->iFrameProved+1, iFrameTryToProve );
    else if ( pAig->pCexSeq == NULL )
    {
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Ga2_ManAbsTranslate( p );
        if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
            Abc_Print( 1, "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
            Abc_Print( 1, "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ", pPars->nRatioMin2, p->pPars->iFrameProved+1 );
        else if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d.  ", pPars->nRatioMin, p->pPars->iFrameProved+1 );
        else
            Abc_Print( 1, "GLA finished %d frames and produced a %d-stable abstraction.  ", p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        p->pPars->iFrame = p->pPars->iFrameProved;
    }
    else
    {
        if ( p->pPars->fVerbose )
            Abc_Print( 1, "\n" );
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "True counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = f - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Ga2_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( p->pGia, p->pPars, p->pSat, p->pPars->iFrameProved, 0 );
    Ga2_ManStop( p );
    fflush( stdout );
    return RetValue;
}